

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsFunctionInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type TVar1;
  AsmJsFunctionInfo *this_00;
  Recycler *pRVar2;
  TypedSlotInfo *pTVar3;
  TypedSlotInfo *typedInfo;
  TypedSlotInfo *info;
  bool local_c5;
  int i_2;
  bool boolVal;
  code *pcStack_c0;
  uint i_1;
  undefined8 local_b8;
  TrackAllocData local_b0;
  Which *local_88;
  Which *typeArray;
  int32 size;
  int i;
  undefined8 local_70;
  TrackAllocData local_68;
  uint *local_40;
  uint *argArray;
  AsmJsRetType AStack_30;
  ArgSlot argSizeArrayLength;
  ArgSlot argByteSize;
  ArgSlot argCount;
  AsmJsFunctionInfo *pAStack_28;
  int retVal;
  AsmJsFunctionInfo *funcInfo;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  funcInfo = (AsmJsFunctionInfo *)function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  pAStack_28 = FunctionBody::AllocateAsmJsFunctionInfo(function);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,(int *)&argByteSize);
  this_00 = pAStack_28;
  AsmJsRetType::AsmJsRetType(&stack0xffffffffffffffd0,_argByteSize);
  AsmJsFunctionInfo::SetReturnType(this_00,AStack_30);
  function_local =
       (FunctionBody *)ReadUInt16(this,(byte *)function_local,(uint16 *)((long)&argArray + 6));
  AsmJsFunctionInfo::SetArgCount(pAStack_28,argArray._6_2_);
  function_local =
       (FunctionBody *)ReadUInt16(this,(byte *)function_local,(uint16 *)((long)&argArray + 4));
  AsmJsFunctionInfo::SetArgByteSize(pAStack_28,argArray._4_2_);
  function_local =
       (FunctionBody *)ReadUInt16(this,(byte *)function_local,(uint16 *)((long)&argArray + 2));
  AsmJsFunctionInfo::SetArgSizeArrayLength(pAStack_28,argArray._2_2_);
  pRVar2 = ScriptContext::GetRecycler(this->scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&unsigned_int::typeinfo,0,(ulong)argArray._2_2_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0xef2);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_68);
  _size = Memory::Recycler::AllocLeafZero;
  local_70 = 0;
  local_40 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                       ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                        (ulong)argArray._2_2_);
  AsmJsFunctionInfo::SetArgsSizesArray(pAStack_28,local_40);
  for (typeArray._4_4_ = 0; typeArray._4_4_ < (int)(uint)argArray._2_2_;
      typeArray._4_4_ = typeArray._4_4_ + 1) {
    function_local =
         (FunctionBody *)ReadConstantSizedInt32(this,(byte *)function_local,(int *)&typeArray);
    local_40[typeArray._4_4_] = (uint)typeArray;
  }
  if (argArray._6_2_ != 0) {
    pRVar2 = ScriptContext::GetRecycler(this->scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b0,(type_info *)&AsmJsVarType::Which::typeinfo,0,(ulong)argArray._6_2_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0xefd);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_b0);
    pcStack_c0 = Memory::Recycler::AllocLeaf;
    local_b8 = 0;
    local_88 = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                         ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeaf,0,
                          (ulong)argArray._6_2_);
    AsmJsFunctionInfo::SetArgTypeArray(pAStack_28,local_88);
    for (i_2 = 0; (uint)i_2 < (uint)argArray._6_2_; i_2 = i_2 + 1) {
      function_local = (FunctionBody *)ReadByte(this,(byte *)function_local,local_88 + (uint)i_2);
    }
  }
  function_local = (FunctionBody *)ReadBool(this,(byte *)function_local,&local_c5);
  AsmJsFunctionInfo::SetUsesHeapBuffer(pAStack_28,(bool)(local_c5 & 1));
  for (info._4_4_ = SIMD; -1 < (int)info._4_4_; info._4_4_ = info._4_4_ - INT64) {
    function_local =
         (FunctionBody *)ReadStruct<WAsmJs::TypedSlotInfo>(this,(byte *)function_local,&typedInfo);
    pTVar3 = AsmJsFunctionInfo::GetTypedSlotInfo(pAStack_28,info._4_4_);
    TVar1 = typedInfo->varCount;
    pTVar3->constCount = typedInfo->constCount;
    pTVar3->varCount = TVar1;
    TVar1 = typedInfo->byteOffset;
    pTVar3->tmpCount = typedInfo->tmpCount;
    pTVar3->byteOffset = TVar1;
    pTVar3->constSrcByteOffset = typedInfo->constSrcByteOffset;
  }
  return (byte *)function_local;
}

Assistant:

const byte * ReadAsmJsFunctionInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsFuncInfo);
#endif

        AsmJsFunctionInfo* funcInfo = function->AllocateAsmJsFunctionInfo();

        int retVal;
        current = ReadInt32(current, &retVal);
        funcInfo->SetReturnType(AsmJsRetType((AsmJsRetType::Which)retVal));

        ArgSlot argCount;
        current = ReadUInt16(current, &argCount);
        funcInfo->SetArgCount(argCount);

        ArgSlot argByteSize;
        current = ReadUInt16(current, &argByteSize);
        funcInfo->SetArgByteSize(argByteSize);

        ArgSlot argSizeArrayLength;
        current = ReadUInt16(current, &argSizeArrayLength);
        funcInfo->SetArgSizeArrayLength(argSizeArrayLength);
        uint* argArray = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), uint, argSizeArrayLength);
        funcInfo->SetArgsSizesArray(argArray);
        for (int i = 0; i < argSizeArrayLength; i++)
        {
            int32 size;
            current = ReadConstantSizedInt32(current, &size);
            argArray[i] = (uint32)size;
        }

        if (argCount > 0)
        {
            AsmJsVarType::Which * typeArray = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), AsmJsVarType::Which, argCount);
            funcInfo->SetArgTypeArray(typeArray);
            for (uint i = 0; i < argCount; i++)
            {
                current = ReadByte(current, (byte*)&typeArray[i]);
            }
        }

        bool boolVal;
        current = ReadBool(current, &boolVal);
        funcInfo->SetUsesHeapBuffer(boolVal);

        for (int i = WAsmJs::LIMIT - 1; i >= 0; --i)
        {
            serialization_alignment WAsmJs::TypedSlotInfo* info;
            current = ReadStruct<WAsmJs::TypedSlotInfo>(current, &info);
            WAsmJs::TypedSlotInfo* typedInfo = funcInfo->GetTypedSlotInfo((WAsmJs::Types)i);
            *typedInfo = *info;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsFuncInfo);
#endif

        return current;
    }